

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O2

bool __thiscall
CoinStatsIndex::CustomInit(CoinStatsIndex *this,optional<interfaces::BlockRef> *block)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int source_line;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  uint256 out;
  DBVal entry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CDBWrapper::Read<unsigned_char,MuHash3072>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,"M14CoinStatsIndex",&this->m_muhash);
  if (bVar2) {
LAB_003d9a23:
    bVar2 = true;
    if ((block->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
        super__Optional_payload_base<interfaces::BlockRef>._M_engaged != true) goto LAB_003d9aec;
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    bVar3 = LookUpOne(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,(BlockRef *)block,&entry);
    if (bVar3) {
      out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      MuHash3072::Finalize(&this->m_muhash,&out);
      bVar3 = operator!=((base_blob<256U> *)&entry,&out.super_base_blob<256U>);
      if (!bVar3) {
        this->m_transaction_output_count = entry.transaction_output_count;
        this->m_bogo_size = entry.bogo_size;
        this->m_total_amount = entry.total_amount;
        this->m_total_subsidy = entry.total_subsidy;
        this->m_total_unspendable_amount = entry.total_unspendable_amount;
        this->m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
        this->m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
        this->m_total_coinbase_amount = entry.total_coinbase_amount;
        this->m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
        this->m_total_unspendables_bip30 = entry.total_unspendables_bip30;
        this->m_total_unspendables_scripts = entry.total_unspendables_scripts;
        this->m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
        goto LAB_003d9aec;
      }
      source_line = 0x17a;
    }
    else {
      source_line = 0x172;
    }
  }
  else {
    bVar2 = CDBWrapper::Exists<unsigned_char>
                      (&((this->m_db)._M_t.
                         super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                         .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                        super_CDBWrapper,"M14CoinStatsIndex");
    if (!bVar2) goto LAB_003d9a23;
    source_line = 0x169;
  }
  logging_function._M_str = "CustomInit";
  logging_function._M_len = 10;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
  ;
  source_file._M_len = 0x68;
  LogPrintFormatInternal<char[11],std::__cxx11::string>
            (logging_function,source_file,source_line,ALL,Error,(ConstevalFormatString<2U>)0x6ceb02,
             (char (*) [11])"CustomInit",&(this->super_BaseIndex).m_name);
  bVar2 = false;
LAB_003d9aec:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomInit(const std::optional<interfaces::BlockRef>& block)
{
    if (!m_db->Read(DB_MUHASH, m_muhash)) {
        // Check that the cause of the read failure is that the key does not
        // exist. Any other errors indicate database corruption or a disk
        // failure, and starting the index would cause further corruption.
        if (m_db->Exists(DB_MUHASH)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }
    }

    if (block) {
        DBVal entry;
        if (!LookUpOne(*m_db, *block, entry)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        uint256 out;
        m_muhash.Finalize(out);
        if (entry.muhash != out) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        m_transaction_output_count = entry.transaction_output_count;
        m_bogo_size = entry.bogo_size;
        m_total_amount = entry.total_amount;
        m_total_subsidy = entry.total_subsidy;
        m_total_unspendable_amount = entry.total_unspendable_amount;
        m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
        m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
        m_total_coinbase_amount = entry.total_coinbase_amount;
        m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
        m_total_unspendables_bip30 = entry.total_unspendables_bip30;
        m_total_unspendables_scripts = entry.total_unspendables_scripts;
        m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
    }

    return true;
}